

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O2

void merge_colors(uint16_t *colors,uint16_t *cached_colors,int n_colors,int n_cached_colors)

{
  ushort uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  ushort uVar6;
  
  if (n_cached_colors != 0) {
    uVar2 = 0;
    uVar3 = 0;
    if (0 < n_colors) {
      uVar3 = (ulong)(uint)n_colors;
    }
    iVar4 = 0;
    iVar5 = n_cached_colors;
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      if (iVar4 < n_cached_colors) {
        uVar6 = cached_colors[iVar4];
        if ((iVar5 < n_colors) && (uVar1 = colors[iVar5], colors[iVar5] < uVar6)) goto LAB_0016c882;
        iVar4 = iVar4 + 1;
      }
      else {
        uVar1 = colors[iVar5];
LAB_0016c882:
        uVar6 = uVar1;
        iVar5 = iVar5 + 1;
      }
      colors[uVar2] = uVar6;
    }
  }
  return;
}

Assistant:

static void merge_colors(uint16_t *colors, uint16_t *cached_colors,
                         int n_colors, int n_cached_colors) {
  if (n_cached_colors == 0) return;
  int cache_idx = 0, trans_idx = n_cached_colors;
  for (int i = 0; i < n_colors; ++i) {
    if (cache_idx < n_cached_colors &&
        (trans_idx >= n_colors ||
         cached_colors[cache_idx] <= colors[trans_idx])) {
      colors[i] = cached_colors[cache_idx++];
    } else {
      assert(trans_idx < n_colors);
      colors[i] = colors[trans_idx++];
    }
  }
}